

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

void read_ref_pic_list_reordering(h264_stream_t *h,bs_t *b)

{
  int iVar1;
  slice_header_t *psVar2;
  int iVar3;
  uint32_t uVar4;
  int *piVar5;
  long lVar6;
  
  psVar2 = h->sh;
  iVar1 = psVar2->slice_type;
  iVar3 = iVar1 + -5;
  if (iVar1 < 5) {
    iVar3 = iVar1;
  }
  if ((iVar3 != 2) && (iVar3 != 4)) {
    uVar4 = bs_read_u1(b);
    (psVar2->rplr).ref_pic_list_reordering_flag_l0 = uVar4;
    if (uVar4 != 0) {
      lVar6 = 0;
      do {
        uVar4 = bs_read_ue(b);
        *(uint32_t *)((long)(psVar2->rplr).reorder_l0.reordering_of_pic_nums_idc + lVar6) = uVar4;
        piVar5 = (psVar2->rplr).reorder_l0.abs_diff_pic_num_minus1;
        if ((uVar4 < 2) || (piVar5 = (psVar2->rplr).reorder_l0.long_term_pic_num, uVar4 == 2)) {
          uVar4 = bs_read_ue(b);
          *(uint32_t *)((long)piVar5 + lVar6) = uVar4;
          uVar4 = *(uint32_t *)((long)(psVar2->rplr).reorder_l0.reordering_of_pic_nums_idc + lVar6);
        }
      } while ((uVar4 != 3) && (lVar6 = lVar6 + 4, b->p < b->end));
    }
  }
  iVar1 = psVar2->slice_type;
  iVar3 = iVar1 + -5;
  if (iVar1 < 5) {
    iVar3 = iVar1;
  }
  if (iVar3 == 1) {
    uVar4 = bs_read_u1(b);
    (psVar2->rplr).ref_pic_list_reordering_flag_l1 = uVar4;
    if (uVar4 != 0) {
      lVar6 = 0;
      do {
        uVar4 = bs_read_ue(b);
        *(uint32_t *)((long)(psVar2->rplr).reorder_l1.reordering_of_pic_nums_idc + lVar6) = uVar4;
        piVar5 = (psVar2->rplr).reorder_l1.abs_diff_pic_num_minus1;
        if ((uVar4 < 2) || (piVar5 = (psVar2->rplr).reorder_l1.long_term_pic_num, uVar4 == 2)) {
          uVar4 = bs_read_ue(b);
          *(uint32_t *)((long)piVar5 + lVar6) = uVar4;
          uVar4 = *(uint32_t *)((long)(psVar2->rplr).reorder_l1.reordering_of_pic_nums_idc + lVar6);
        }
      } while ((uVar4 != 3) && (lVar6 = lVar6 + 4, b->p < b->end));
    }
  }
  return;
}

Assistant:

void read_ref_pic_list_reordering(h264_stream_t* h, bs_t* b)
{
    slice_header_t* sh = h->sh;
    // FIXME should be an array

    if( ! is_slice_type( sh->slice_type, SH_SLICE_TYPE_I ) && ! is_slice_type( sh->slice_type, SH_SLICE_TYPE_SI ) )
    {
        sh->rplr.ref_pic_list_reordering_flag_l0 = bs_read_u1(b);
        if( sh->rplr.ref_pic_list_reordering_flag_l0 )
        {
            int n = -1;
            do
            {
                n++;
                sh->rplr.reorder_l0.reordering_of_pic_nums_idc[ n ] = bs_read_ue(b);
                if( sh->rplr.reorder_l0.reordering_of_pic_nums_idc[ n ] == 0 ||
                    sh->rplr.reorder_l0.reordering_of_pic_nums_idc[ n ] == 1 )
                {
                    sh->rplr.reorder_l0.abs_diff_pic_num_minus1[ n ] = bs_read_ue(b);
                }
                else if( sh->rplr.reorder_l0.reordering_of_pic_nums_idc[ n ] == 2 )
                {
                    sh->rplr.reorder_l0.long_term_pic_num[ n ] = bs_read_ue(b);
                }
            } while( sh->rplr.reorder_l0.reordering_of_pic_nums_idc[ n ] != 3 && ! bs_eof(b) );
        }
    }
    if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_B ) )
    {
        sh->rplr.ref_pic_list_reordering_flag_l1 = bs_read_u1(b);
        if( sh->rplr.ref_pic_list_reordering_flag_l1 )
        {
            int n = -1;
            do
            {
                n++;
                sh->rplr.reorder_l1.reordering_of_pic_nums_idc[ n ] = bs_read_ue(b);
                if( sh->rplr.reorder_l1.reordering_of_pic_nums_idc[ n ] == 0 ||
                    sh->rplr.reorder_l1.reordering_of_pic_nums_idc[ n ] == 1 )
                {
                    sh->rplr.reorder_l1.abs_diff_pic_num_minus1[ n ] = bs_read_ue(b);
                }
                else if( sh->rplr.reorder_l1.reordering_of_pic_nums_idc[ n ] == 2 )
                {
                    sh->rplr.reorder_l1.long_term_pic_num[ n ] = bs_read_ue(b);
                }
            } while( sh->rplr.reorder_l1.reordering_of_pic_nums_idc[ n ] != 3 && ! bs_eof(b) );
        }
    }
}